

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O1

int GENERAL_NAME_get0_otherName(GENERAL_NAME *gen,ASN1_OBJECT **poid,ASN1_TYPE **pvalue)

{
  int iVar1;
  
  iVar1 = 0;
  if (gen->type == 0) {
    if (poid != (ASN1_OBJECT **)0x0) {
      *poid = ((gen->d).otherName)->type_id;
    }
    iVar1 = 1;
    if (pvalue != (ASN1_TYPE **)0x0) {
      *pvalue = ((gen->d).otherName)->value;
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int GENERAL_NAME_get0_otherName(const GENERAL_NAME *gen, ASN1_OBJECT **out_oid,
                                ASN1_TYPE **out_value) {
  if (gen->type != GEN_OTHERNAME) {
    return 0;
  }
  if (out_oid != NULL) {
    *out_oid = gen->d.otherName->type_id;
  }
  if (out_value != NULL) {
    *out_value = gen->d.otherName->value;
  }
  return 1;
}